

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

Object * __thiscall json::Object::add<json::Integer,long>(Object *this,string *key,long *v)

{
  long lVar1;
  Integer *pIVar2;
  runtime_error *this_00;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common::XPtr<json::Type>_>_>,_bool>
  pVar3;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json::Integer_*>
  pStack_58;
  
  pIVar2 = (Integer *)operator_new(0x10);
  lVar1 = *v;
  (pIVar2->super_Type)._vptr_Type = (_func_int **)&PTR_clone_00132c20;
  pIVar2->value = lVar1;
  std::__cxx11::string::string((string *)&pStack_58,(string *)key);
  pStack_58.second = pIVar2;
  pVar3 = std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,common::XPtr<json::Type>>,std::_Select1st<std::pair<std::__cxx11::string_const,common::XPtr<json::Type>>>,std::less<std::__cxx11::string>,common::clean_allocator<std::pair<std::__cxx11::string_const,common::XPtr<json::Type>>>>
          ::_M_emplace_unique<std::pair<std::__cxx11::string,json::Integer*>>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,common::XPtr<json::Type>>,std::_Select1st<std::pair<std::__cxx11::string_const,common::XPtr<json::Type>>>,std::less<std::__cxx11::string>,common::clean_allocator<std::pair<std::__cxx11::string_const,common::XPtr<json::Type>>>>
                      *)&this->fields,&pStack_58);
  std::__cxx11::string::~string((string *)&pStack_58);
  if (((undefined1  [16])pVar3 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    return this;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"can\'t insert field");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Object& add(std::string const& key, V const& v) {
            json_assert(fields.insert(std::make_pair(key, new T(v))).second, "can't insert field");
            return *this;
        }